

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UCharIterator *left,UCharIterator *right,UErrorCode *errorCode)

{
  Normalizer2Impl *nfcImpl_00;
  UBool UVar1;
  UBool UVar2;
  int c;
  int c_00;
  UChar32 c_01;
  int32_t iVar3;
  bool bVar4;
  undefined1 local_bb0 [8];
  FCDUIterNFDIterator rightIter_3;
  FCDUIterNFDIterator leftIter_3;
  UIterNFDIterator rightIter_2;
  UIterNFDIterator leftIter_2;
  Normalizer2Impl *nfcImpl;
  FCDUIterCollationIterator rightIter_1;
  FCDUIterCollationIterator leftIter_1;
  undefined1 local_368 [8];
  UIterCollationIterator rightIter;
  UIterCollationIterator leftIter;
  UCollationResult result;
  UChar32 rightUnit;
  UChar32 leftUnit;
  int32_t equalPrefixLength;
  UBool numeric;
  UErrorCode *errorCode_local;
  UCharIterator *right_local;
  UCharIterator *left_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (left != right)) {
    UVar1 = CollationSettings::isNumeric(this->settings);
    rightUnit = 0;
    while( true ) {
      c = (*(code *)left->next)(left);
      c_00 = (*(code *)right->next)(right);
      if (c != c_00) break;
      if (c < 0) {
        return UCOL_EQUAL;
      }
      rightUnit = rightUnit + 1;
    }
    if (-1 < c) {
      (*(code *)left->previous)(left);
    }
    if (-1 < c_00) {
      (*(code *)right->previous)(right);
    }
    if ((0 < rightUnit) &&
       (((-1 < c && (UVar2 = CollationData::isUnsafeBackward(this->data,c,UVar1), UVar2 != '\0')) ||
        ((-1 < c_00 &&
         (UVar2 = CollationData::isUnsafeBackward(this->data,c_00,UVar1), UVar2 != '\0')))))) {
      do {
        rightUnit = rightUnit + -1;
        c_01 = (*(code *)left->previous)(left);
        (*(code *)right->previous)(right);
        bVar4 = false;
        if (0 < rightUnit) {
          UVar2 = CollationData::isUnsafeBackward(this->data,c_01,UVar1);
          bVar4 = UVar2 != '\0';
        }
      } while (bVar4);
    }
    UVar2 = CollationSettings::dontCheckFCD(this->settings);
    if (UVar2 == '\0') {
      FCDUIterCollationIterator::FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)((long)&rightIter_1.normalized.fUnion + 0x30),
                 this->data,UVar1,left,rightUnit);
      FCDUIterCollationIterator::FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)&nfcImpl,this->data,UVar1,right,rightUnit);
      leftIter.iter._4_4_ =
           CollationCompare::compareUpToQuaternary
                     ((CollationIterator *)((long)&rightIter_1.normalized.fUnion + 0x30),
                      (CollationIterator *)&nfcImpl,this->settings,errorCode);
      FCDUIterCollationIterator::~FCDUIterCollationIterator((FCDUIterCollationIterator *)&nfcImpl);
      FCDUIterCollationIterator::~FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)((long)&rightIter_1.normalized.fUnion + 0x30));
    }
    else {
      UIterCollationIterator::UIterCollationIterator
                ((UIterCollationIterator *)&rightIter.iter,this->data,UVar1,left);
      UIterCollationIterator::UIterCollationIterator
                ((UIterCollationIterator *)local_368,this->data,UVar1,right);
      leftIter.iter._4_4_ =
           CollationCompare::compareUpToQuaternary
                     ((CollationIterator *)&rightIter.iter,(CollationIterator *)local_368,
                      this->settings,errorCode);
      UIterCollationIterator::~UIterCollationIterator((UIterCollationIterator *)local_368);
      UIterCollationIterator::~UIterCollationIterator((UIterCollationIterator *)&rightIter.iter);
    }
    if (((leftIter.iter._4_4_ == UCOL_EQUAL) &&
        (iVar3 = CollationSettings::getStrength(this->settings), 0xe < iVar3)) &&
       (UVar1 = ::U_FAILURE(*errorCode), UVar1 == '\0')) {
      (*left->move)(left,rightUnit,UITER_ZERO);
      (*right->move)(right,rightUnit,UITER_ZERO);
      nfcImpl_00 = this->data->nfcImpl;
      UVar1 = CollationSettings::dontCheckFCD(this->settings);
      if (UVar1 == '\0') {
        anon_unknown_16::FCDUIterNFDIterator::FCDUIterNFDIterator
                  ((FCDUIterNFDIterator *)((long)&rightIter_3.uici.normalized.fUnion + 0x30),
                   this->data,left,rightUnit);
        anon_unknown_16::FCDUIterNFDIterator::FCDUIterNFDIterator
                  ((FCDUIterNFDIterator *)local_bb0,this->data,right,rightUnit);
        this_local._4_4_ =
             anon_unknown_16::compareNFDIter
                       (nfcImpl_00,(NFDIterator *)((long)&rightIter_3.uici.normalized.fUnion + 0x30)
                        ,(NFDIterator *)local_bb0);
        anon_unknown_16::FCDUIterNFDIterator::~FCDUIterNFDIterator((FCDUIterNFDIterator *)local_bb0)
        ;
        anon_unknown_16::FCDUIterNFDIterator::~FCDUIterNFDIterator
                  ((FCDUIterNFDIterator *)((long)&rightIter_3.uici.normalized.fUnion + 0x30));
      }
      else {
        anon_unknown_16::UIterNFDIterator::UIterNFDIterator
                  ((UIterNFDIterator *)&rightIter_2.iter,left);
        anon_unknown_16::UIterNFDIterator::UIterNFDIterator
                  ((UIterNFDIterator *)((long)&leftIter_3.uici.normalized.fUnion + 0x30),right);
        this_local._4_4_ =
             anon_unknown_16::compareNFDIter
                       (nfcImpl_00,(NFDIterator *)&rightIter_2.iter,
                        (NFDIterator *)((long)&leftIter_3.uici.normalized.fUnion + 0x30));
        anon_unknown_16::UIterNFDIterator::~UIterNFDIterator
                  ((UIterNFDIterator *)((long)&leftIter_3.uici.normalized.fUnion + 0x30));
        anon_unknown_16::UIterNFDIterator::~UIterNFDIterator((UIterNFDIterator *)&rightIter_2.iter);
      }
    }
    else {
      this_local._4_4_ = leftIter.iter._4_4_;
    }
  }
  else {
    this_local._4_4_ = UCOL_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(UCharIterator &left, UCharIterator &right,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode) || &left == &right) { return UCOL_EQUAL; }
    UBool numeric = settings->isNumeric();

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    {
        UChar32 leftUnit;
        UChar32 rightUnit;
        while((leftUnit = left.next(&left)) == (rightUnit = right.next(&right))) {
            if(leftUnit < 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }

        // Back out the code units that differed, for the real collation comparison.
        if(leftUnit >= 0) { left.previous(&left); }
        if(rightUnit >= 0) { right.previous(&right); }

        if(equalPrefixLength > 0) {
            if((leftUnit >= 0 && data->isUnsafeBackward(leftUnit, numeric)) ||
                    (rightUnit >= 0 && data->isUnsafeBackward(rightUnit, numeric))) {
                // Identical prefix: Back up to the start of a contraction or reordering sequence.
                do {
                    --equalPrefixLength;
                    leftUnit = left.previous(&left);
                    right.previous(&right);
                } while(equalPrefixLength > 0 && data->isUnsafeBackward(leftUnit, numeric));
            }
            // See the notes in the UTF-16 version.
        }
    }

    UCollationResult result;
    if(settings->dontCheckFCD()) {
        UIterCollationIterator leftIter(data, numeric, left);
        UIterCollationIterator rightIter(data, numeric, right);
        result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
    } else {
        FCDUIterCollationIterator leftIter(data, numeric, left, equalPrefixLength);
        FCDUIterCollationIterator rightIter(data, numeric, right, equalPrefixLength);
        result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return result;
    }

    // Compare identical level.
    left.move(&left, equalPrefixLength, UITER_ZERO);
    right.move(&right, equalPrefixLength, UITER_ZERO);
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    if(settings->dontCheckFCD()) {
        UIterNFDIterator leftIter(left);
        UIterNFDIterator rightIter(right);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUIterNFDIterator leftIter(data, left, equalPrefixLength);
        FCDUIterNFDIterator rightIter(data, right, equalPrefixLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}